

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O0

int Ssw_ManSweepBmcFilter(Ssw_Man_t *p,int TimeLimit)

{
  Vec_Ptr_t *p_00;
  uint *p_01;
  Ssw_Sat_t *p_02;
  int iVar1;
  abctime aVar2;
  Aig_Man_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t **ppAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  abctime aVar7;
  Aig_Obj_t **pNodeToFrames;
  abctime clkTotal;
  int local_40;
  int i;
  int f1;
  int f;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  int TimeLimit_local;
  Ssw_Man_t *p_local;
  
  aVar2 = Abc_Clock();
  iVar1 = Aig_ManObjNumMax(p->pAig);
  pAVar3 = Aig_ManStart(iVar1 * p->pPars->nFramesK);
  p->pFrames = pAVar3;
  for (clkTotal._4_4_ = 0; iVar1 = Saig_ManRegNum(p->pAig), clkTotal._4_4_ < iVar1;
      clkTotal._4_4_ = clkTotal._4_4_ + 1) {
    p_00 = p->pAig->vCis;
    iVar1 = Saig_ManPiNum(p->pAig);
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00,clkTotal._4_4_ + iVar1);
    p_01 = p->pPatWords;
    iVar1 = Saig_ManPiNum(p->pAig);
    iVar1 = Abc_InfoHasBit(p_01,iVar1 + clkTotal._4_4_);
    if (iVar1 == 0) {
      pAVar6 = Aig_ManConst0(p->pFrames);
      Ssw_ObjSetFrame(p,pAVar4,0,pAVar6);
    }
    else {
      pAVar6 = Aig_ManConst1(p->pFrames);
      Ssw_ObjSetFrame(p,pAVar4,0,pAVar6);
    }
  }
  i = 0;
  do {
    if (p->pPars->nFramesK <= i) {
      return 1;
    }
    if (i == p->nFrames + -1) {
      iVar1 = Aig_ManObjNumMax(p->pAig);
      ppAVar5 = (Aig_Obj_t **)calloc((long)(iVar1 * 2 * p->nFrames),8);
      for (local_40 = 0; local_40 < p->nFrames; local_40 = local_40 + 1) {
        for (clkTotal._4_4_ = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), clkTotal._4_4_ < iVar1;
            clkTotal._4_4_ = clkTotal._4_4_ + 1) {
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,clkTotal._4_4_);
          if (pAVar4 != (Aig_Obj_t *)0x0) {
            pAVar6 = Ssw_ObjFrame(p,pAVar4,local_40);
            ppAVar5[p->nFrames * 2 * pAVar4->Id + local_40] = pAVar6;
          }
        }
      }
      if (p->pNodeToFrames != (Aig_Obj_t **)0x0) {
        free(p->pNodeToFrames);
        p->pNodeToFrames = (Aig_Obj_t **)0x0;
      }
      p->pNodeToFrames = ppAVar5;
      p->nFrames = p->nFrames << 1;
    }
    pAVar4 = Aig_ManConst1(p->pAig);
    pAVar6 = Aig_ManConst1(p->pFrames);
    Ssw_ObjSetFrame(p,pAVar4,i,pAVar6);
    for (clkTotal._4_4_ = 0; iVar1 = Saig_ManPiNum(p->pAig), clkTotal._4_4_ < iVar1;
        clkTotal._4_4_ = clkTotal._4_4_ + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,clkTotal._4_4_);
      pAVar6 = Aig_ObjCreateCi(p->pFrames);
      Ssw_ObjSetFrame(p,pAVar4,i,pAVar6);
    }
    for (clkTotal._4_4_ = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), clkTotal._4_4_ < iVar1;
        clkTotal._4_4_ = clkTotal._4_4_ + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,clkTotal._4_4_);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
        pAVar3 = p->pFrames;
        pAVar6 = Ssw_ObjChild0Fra(p,pAVar4,i);
        p1 = Ssw_ObjChild1Fra(p,pAVar4,i);
        pAVar6 = Aig_And(pAVar3,pAVar6,p1);
        Ssw_ObjSetFrame(p,pAVar4,i,pAVar6);
        iVar1 = Ssw_ManSweepNodeFilter(p,pAVar4,i);
        if (iVar1 != 0) break;
      }
    }
    if (p->pPars->fVerbose != 0) {
      Abc_Print(1,"Frame %4d : ",(ulong)(uint)i);
      Ssw_ClassesPrint(p->ppClasses,0);
    }
    iVar1 = Vec_PtrSize(p->pAig->vObjs);
    if (clkTotal._4_4_ < iVar1) {
      if (p->pPars->fVerbose == 0) {
        return 1;
      }
      Abc_Print(1,"Exceeded the resource limits (%d conflicts). Quitting...\n",
                (ulong)(uint)p->pPars->nBTLimit);
      return 1;
    }
    if (i == p->pPars->nFramesK + -1) {
      if (p->pPars->fVerbose == 0) {
        return 1;
      }
      Abc_Print(1,"Exceeded the time frame limit (%d time frames). Quitting...\n",
                (ulong)(uint)p->pPars->nFramesK);
      return 1;
    }
    if ((TimeLimit != 0) &&
       (aVar7 = Abc_Clock(), (float)TimeLimit <= (float)(aVar7 - aVar2) / 1e+06)) {
      return 1;
    }
    for (clkTotal._4_4_ = 0; iVar1 = Vec_PtrSize(p->pAig->vCos), clkTotal._4_4_ < iVar1;
        clkTotal._4_4_ = clkTotal._4_4_ + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,clkTotal._4_4_);
      pAVar6 = Ssw_ObjChild0Fra(p,pAVar4,i);
      Ssw_ObjSetFrame(p,pAVar4,i,pAVar6);
    }
    for (clkTotal._4_4_ = 0; iVar1 = Saig_ManRegNum(p->pAig), clkTotal._4_4_ < iVar1;
        clkTotal._4_4_ = clkTotal._4_4_ + 1) {
      pAVar4 = Saig_ManLi(p->pAig,clkTotal._4_4_);
      pAVar6 = Saig_ManLo(p->pAig,clkTotal._4_4_);
      pAVar4 = Ssw_ObjFrame(p,pAVar4,i);
      Ssw_ObjSetFrame(p,pAVar6,i + 1,pAVar4);
      p_02 = p->pMSat;
      pAVar4 = Aig_Regular(pAVar4);
      Ssw_CnfNodeAddToSolver(p_02,pAVar4);
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Ssw_ManSweepBmcFilter( Ssw_Man_t * p, int TimeLimit )
{
    Aig_Obj_t * pObj, * pObjNew, * pObjLi, * pObjLo;
    int f, f1, i;
    abctime clkTotal = Abc_Clock();
    // start initialized timeframes
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        if ( Abc_InfoHasBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i ) )
        {
            Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst1(p->pFrames) );
//Abc_Print( 1, "1" );
        }
        else
        {
            Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrames) );
//Abc_Print( 1, "0" );
        }
    }
//Abc_Print( 1, "\n" );

    // sweep internal nodes
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // realloc mapping of timeframes
        if ( f == p->nFrames-1 )
        {
            Aig_Obj_t ** pNodeToFrames;
            pNodeToFrames = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) * 2 * p->nFrames );
            for ( f1 = 0; f1 < p->nFrames; f1++ )
            {
                Aig_ManForEachObj( p->pAig, pObj, i )
                    pNodeToFrames[2*p->nFrames*pObj->Id + f1] = Ssw_ObjFrame( p, pObj, f1 );
            }
            ABC_FREE( p->pNodeToFrames );
            p->pNodeToFrames = pNodeToFrames;
            p->nFrames *= 2;
        }
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(p->pFrames);
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
        }
        // sweep internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            if ( Ssw_ManSweepNodeFilter( p, pObj, f ) )
                break;
        }
        // printout
        if ( p->pPars->fVerbose )
        {
            Abc_Print( 1, "Frame %4d : ", f );
            Ssw_ClassesPrint( p->ppClasses, 0 );
        }
        if ( i < Vec_PtrSize(p->pAig->vObjs) )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Exceeded the resource limits (%d conflicts). Quitting...\n", p->pPars->nBTLimit );
            break;
        }
        // quit if this is the last timeframe
        if ( f == p->pPars->nFramesK - 1 )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Exceeded the time frame limit (%d time frames). Quitting...\n", p->pPars->nFramesK );
            break;
        }
        // check timeout
        if ( TimeLimit && ((float)TimeLimit <= (float)(Abc_Clock()-clkTotal)/(float)(CLOCKS_PER_SEC)) )
            break;
        // transfer latch input to the latch outputs 
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj, f) );
        // build logic cones for register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Ssw_ObjFrame( p, pObjLi, f );
            Ssw_ObjSetFrame( p, pObjLo, f+1, pObjNew );
            Ssw_CnfNodeAddToSolver( p->pMSat, Aig_Regular(pObjNew) );//
        }
    }
    // verify
//    Ssw_ClassesCheck( p->ppClasses );
    return 1;
}